

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

string * __thiscall
pbrt::SpectrumScaledTexture::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SpectrumScaledTexture *this)

{
  FloatTextureHandle *in_R8;
  
  StringPrintf<pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&>
            (__return_storage_ptr__,(pbrt *)"[ SpectrumScaledTexture tex: %s scale: %s ]",
             (char *)this,(SpectrumTextureHandle *)&this->scale,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string SpectrumScaledTexture::ToString() const {
    return StringPrintf("[ SpectrumScaledTexture tex: %s scale: %s ]", tex, scale);
}